

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O1

FT_Error ft_svg_glyph_init(FT_Glyph svg_glyph,FT_GlyphSlot slot)

{
  undefined8 *puVar1;
  FT_Glyph_Class *__n;
  FT_Pos FVar2;
  FT_Library pFVar3;
  FT_Glyph_Class *pFVar4;
  undefined8 uVar5;
  FT_Pos FVar6;
  FT_Library __dest;
  FT_Error error;
  FT_Error local_2c;
  
  local_2c = 0;
  if (slot->format == FT_GLYPH_FORMAT_SVG) {
    puVar1 = (undefined8 *)slot->other;
    if ((puVar1 == (undefined8 *)0x0) ||
       (__n = (FT_Glyph_Class *)puVar1[1], __n == (FT_Glyph_Class *)0x0)) {
      local_2c = 0x25;
    }
    else {
      __dest = (FT_Library)ft_mem_qalloc(svg_glyph->library->memory,(FT_Long)__n,&local_2c);
      svg_glyph[1].library = __dest;
      if (local_2c == 0) {
        svg_glyph[1].clazz = __n;
        svg_glyph[1].format = slot->glyph_index;
        FVar2 = puVar1[3];
        pFVar3 = (FT_Library)puVar1[4];
        pFVar4 = (FT_Glyph_Class *)puVar1[5];
        uVar5 = puVar1[6];
        FVar6 = puVar1[7];
        svg_glyph[1].advance.x = puVar1[2];
        svg_glyph[1].advance.y = FVar2;
        svg_glyph[2].library = pFVar3;
        svg_glyph[2].clazz = pFVar4;
        *(undefined8 *)&svg_glyph[2].format = uVar5;
        svg_glyph[2].advance.x = FVar6;
        svg_glyph[2].advance.y = puVar1[8];
        *(undefined2 *)&svg_glyph[3].library = *(undefined2 *)(puVar1 + 9);
        *(undefined2 *)((long)&svg_glyph[3].library + 2) = *(undefined2 *)((long)puVar1 + 0x4a);
        *(undefined2 *)((long)&svg_glyph[3].library + 4) = *(undefined2 *)((long)puVar1 + 0x4c);
        pFVar4 = (FT_Glyph_Class *)puVar1[10];
        uVar5 = puVar1[0xb];
        FVar2 = puVar1[0xd];
        svg_glyph[3].advance.x = puVar1[0xc];
        svg_glyph[3].advance.y = FVar2;
        svg_glyph[3].clazz = pFVar4;
        *(undefined8 *)&svg_glyph[3].format = uVar5;
        pFVar4 = (FT_Glyph_Class *)puVar1[0xf];
        svg_glyph[4].library = (FT_Library)puVar1[0xe];
        svg_glyph[4].clazz = pFVar4;
        memcpy(__dest,(void *)*puVar1,(size_t)__n);
      }
    }
  }
  else {
    local_2c = 0x12;
  }
  return local_2c;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  ft_svg_glyph_init( FT_Glyph      svg_glyph,
                     FT_GlyphSlot  slot )
  {
    FT_ULong         doc_length;
    FT_SVG_Document  document;
    FT_SvgGlyph      glyph = (FT_SvgGlyph)svg_glyph;

    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = FT_GLYPH( glyph )->library->memory;


    if ( slot->format != FT_GLYPH_FORMAT_SVG )
    {
      error = FT_THROW( Invalid_Glyph_Format );
      goto Exit;
    }

    if ( slot->other == NULL )
    {
      error = FT_THROW( Invalid_Slot_Handle );
      goto Exit;
    }

    document = (FT_SVG_Document)slot->other;

    if ( document->svg_document_length == 0 )
    {
      error = FT_THROW( Invalid_Slot_Handle );
      goto Exit;
    }

    /* allocate a new document */
    doc_length = document->svg_document_length;
    if ( FT_QALLOC( glyph->svg_document, doc_length ) )
      goto Exit;
    glyph->svg_document_length = doc_length;

    glyph->glyph_index = slot->glyph_index;

    glyph->metrics      = document->metrics;
    glyph->units_per_EM = document->units_per_EM;

    glyph->start_glyph_id = document->start_glyph_id;
    glyph->end_glyph_id   = document->end_glyph_id;

    glyph->transform = document->transform;
    glyph->delta     = document->delta;

    /* copy the document into glyph */
    FT_MEM_COPY( glyph->svg_document, document->svg_document, doc_length );

  Exit:
    return error;
  }